

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void slang::ast::GenvarSymbol::fromSyntax
               (Scope *parent,GenvarDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::GenvarSymbol_*> *results)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  SourceLocation this;
  long in_RSI;
  Scope *in_RDI;
  string_view sVar2;
  GenvarSymbol *genvar;
  Token name;
  IdentifierNameSyntax *id;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *__range2;
  Compilation *comp;
  Compilation *in_stack_ffffffffffffff48;
  Symbol *in_stack_ffffffffffffff50;
  Token *in_stack_ffffffffffffff60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  Symbol *pSVar3;
  __extent_storage<18446744073709551615UL> _Var4;
  Token local_60;
  IdentifierNameSyntax *local_50;
  const_iterator local_48;
  const_iterator local_38;
  long local_28;
  Compilation *local_20;
  long local_10;
  Scope *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = Scope::getCompilation(in_RDI);
  local_28 = local_10 + 0x60;
  local_38 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::begin
                       ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)0xff9285);
  local_48 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::end
                       ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)0xff92a2);
  while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>_>
                           ((self_type *)in_stack_ffffffffffffff50,
                            (iterator_base<const_slang::syntax::IdentifierNameSyntax_*> *)
                            in_stack_ffffffffffffff48), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_50 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_false>
               ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_false>
                            *)0xff92d6);
    local_60.kind = (local_50->identifier).kind;
    local_60._2_1_ = (local_50->identifier).field_0x2;
    local_60.numFlags.raw = (local_50->identifier).numFlags.raw;
    local_60.rawLen = (local_50->identifier).rawLen;
    local_60.info = (local_50->identifier).info;
    sVar2 = parsing::Token::valueText(in_stack_ffffffffffffff60);
    _Var4._M_extent_value = sVar2._M_len;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff90)
    ;
    if (!bVar1) {
      in_stack_ffffffffffffff48 = local_20;
      sVar2 = parsing::Token::valueText(in_stack_ffffffffffffff60);
      this = parsing::Token::location(&local_60);
      in_stack_ffffffffffffff50 =
           &BumpAllocator::
            emplace<slang::ast::GenvarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                      ((BumpAllocator *)this,in_stack_ffffffffffffff68,
                       (SourceLocation *)in_stack_ffffffffffffff60)->super_Symbol;
      Symbol::setSyntax(in_stack_ffffffffffffff50,(SyntaxNode *)local_50);
      pSVar3 = in_stack_ffffffffffffff50;
      std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
      span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                  *)in_stack_ffffffffffffff60,
                 (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_8);
      syntax_00._M_extent._M_extent_value = _Var4._M_extent_value;
      syntax_00._M_ptr = (pointer)pSVar3;
      Symbol::setAttributes((Symbol *)sVar2._M_str,(Scope *)sVar2._M_len,syntax_00);
      SmallVectorBase<const_slang::ast::GenvarSymbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::GenvarSymbol_*> *)in_stack_ffffffffffffff50,
                 (GenvarSymbol **)in_stack_ffffffffffffff48);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_false>
                *)in_stack_ffffffffffffff50);
  }
  return;
}

Assistant:

void GenvarSymbol::fromSyntax(const Scope& parent, const GenvarDeclarationSyntax& syntax,
                              SmallVectorBase<const GenvarSymbol*>& results) {
    auto& comp = parent.getCompilation();
    for (auto id : syntax.identifiers) {
        auto name = id->identifier;
        if (name.valueText().empty())
            continue;

        auto genvar = comp.emplace<GenvarSymbol>(name.valueText(), name.location());
        genvar->setSyntax(*id);
        genvar->setAttributes(parent, syntax.attributes);
        results.push_back(genvar);
    }
}